

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t test_run(wchar_t i,char *tmpdir)

{
  wchar_t wVar1;
  wchar_t wVar2;
  __mode_t __mask;
  wchar_t wVar3;
  mode_t oldumask;
  wchar_t skips_before;
  wchar_t failures_before;
  char logfilename [64];
  char workdir [8192];
  char *tmpdir_local;
  wchar_t i_local;
  
  wVar1 = skips;
  wVar3 = failures;
  if (verbosity != L'\xffffffff') {
    if (verbosity == L'\0') {
      printf("%3d: %-64s",(ulong)(uint)i,tests[i].name);
      fflush(_stdout);
    }
    else {
      printf("%3d: %s\n",(ulong)(uint)i,tests[i].name);
    }
  }
  wVar2 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                          ,L'ก',tmpdir);
  if (wVar2 != L'\0') {
    snprintf((char *)&skips_before,0x40,"%s.log",tests[i].name);
    logfile = (FILE *)fopen((char *)&skips_before,"w");
    fprintf((FILE *)logfile,"%s\n\n",tests[i].name);
    snprintf(logfilename + 0x38,0x2000,"%s/%s",tmpdir,tests[i].name);
    testworkdir = logfilename + 0x38;
    wVar2 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                               ,L'ญ',testworkdir,L'ǭ');
    if ((wVar2 != L'\0') &&
       (wVar2 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                ,L'ฎ',testworkdir), wVar2 != L'\0')) {
      setlocale(6,"C");
      __mask = umask(0);
      umask(__mask);
      (*tests[i].func)();
      testworkdir = (char *)0x0;
      umask(__mask);
      setlocale(6,"C");
      wVar2 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                              ,L'ฤ',tmpdir);
      if (wVar2 != L'\0') {
        tests[i].failures = failures - wVar3;
        test_summarize(tests[i].failures,skips - wVar1);
        fclose((FILE *)logfile);
        logfile = (FILE *)0x0;
        if (((tests[i].failures == 0) && (keep_temp_files == L'\0')) &&
           (wVar3 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                    ,L'ั',tmpdir), wVar3 != L'\0')) {
          systemf("rm -rf %s",tests[i].name);
          systemf("rm %s",&skips_before);
        }
        return tests[i].failures;
      }
      fprintf(_stderr,"ERROR: Couldn\'t chdir to temp dir %s\n",tmpdir);
      exit(1);
    }
    fprintf(_stderr,"ERROR: Can\'t chdir to work dir %s\n",testworkdir);
    exit(1);
  }
  fprintf(_stderr,"ERROR: Can\'t chdir to top work dir %s\n",tmpdir);
  exit(1);
}

Assistant:

static int
test_run(int i, const char *tmpdir)
{
#ifdef PATH_MAX
	char workdir[PATH_MAX * 2];
#else
	char workdir[1024 * 2];
#endif
	char logfilename[64];
	int failures_before = failures;
	int skips_before = skips;
	mode_t oldumask;

	switch (verbosity) {
	case VERBOSITY_SUMMARY_ONLY: /* No per-test reports at all */
		break;
	case VERBOSITY_PASSFAIL: /* rest of line will include ok/FAIL marker */
		printf("%3d: %-64s", i, tests[i].name);
		fflush(stdout);
		break;
	default: /* Title of test, details will follow */
		printf("%3d: %s\n", i, tests[i].name);
	}

	/* Chdir to the top-level work directory. */
	if (!assertChdir(tmpdir)) {
		fprintf(stderr,
		    "ERROR: Can't chdir to top work dir %s\n", tmpdir);
		exit(1);
	}
	/* Create a log file for this test. */
	snprintf(logfilename, sizeof(logfilename), "%s.log", tests[i].name);
	logfile = fopen(logfilename, "w");
	fprintf(logfile, "%s\n\n", tests[i].name);
	/* Chdir() to a work dir for this specific test. */
	snprintf(workdir, sizeof(workdir), "%s/%s", tmpdir, tests[i].name);
	testworkdir = workdir;
	if (!assertMakeDir(testworkdir, 0755)
	    || !assertChdir(testworkdir)) {
		fprintf(stderr,
		    "ERROR: Can't chdir to work dir %s\n", testworkdir);
		exit(1);
	}
	/* Explicitly reset the locale before each test. */
	setlocale(LC_ALL, "C");
	/* Record the umask before we run the test. */
	umask(oldumask = umask(0));
	/*
	 * Run the actual test.
	 */
	(*tests[i].func)();
	/*
	 * Clean up and report afterwards.
	 */
	testworkdir = NULL;
	/* Restore umask */
	umask(oldumask);
	/* Reset locale. */
	setlocale(LC_ALL, "C");
	/* Reset directory. */
	if (!assertChdir(tmpdir)) {
		fprintf(stderr, "ERROR: Couldn't chdir to temp dir %s\n",
		    tmpdir);
		exit(1);
	}
	/* Report per-test summaries. */
	tests[i].failures = failures - failures_before;
	test_summarize(tests[i].failures, skips - skips_before);
	/* Close the per-test log file. */
	fclose(logfile);
	logfile = NULL;
	/* If there were no failures, we can remove the work dir and logfile. */
	if (tests[i].failures == 0) {
		if (!keep_temp_files && assertChdir(tmpdir)) {
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* Make sure not to leave empty directories.
			 * Sometimes a processing of closing files used by tests
			 * is not done, then rmdir will be failed and it will
			 * leave a empty test directory. So we should wait a few
			 * seconds and retry rmdir. */
			int r, t;
			for (t = 0; t < 10; t++) {
				if (t > 0)
					Sleep(1000);
				r = systemf("rmdir /S /Q %s", tests[i].name);
				if (r == 0)
					break;
			}
			systemf("del %s", logfilename);
#else
			systemf("rm -rf %s", tests[i].name);
			systemf("rm %s", logfilename);
#endif
		}
	}
	/* Return appropriate status. */
	return (tests[i].failures);
}